

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

bool __thiscall
Clasp::Cli::ClaspCliConfig::setConfig
          (ClaspCliConfig *this,ConfigIter *config,uint8 mode,uint32 sId,ParsedOpts *exclude,
          ParsedOpts *out)

{
  bool bVar1;
  size_t sVar2;
  ConfigIter __s;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  ConfigKey baseK;
  ConfigKey local_4c;
  ConfigIter *local_48;
  ParsedOpts *local_40;
  ParsedOpts *local_38;
  
  pcVar5 = config->base_;
  sVar2 = strlen(pcVar5);
  if (pcVar5[sVar2 + 2] != '\0') {
    local_4c = config_default;
    local_48 = config;
    local_40 = out;
    local_38 = exclude;
    sVar2 = strlen(pcVar5);
    bVar1 = Potassco::string_cast<Clasp::Cli::ConfigKey>(pcVar5 + sVar2 + 2,&local_4c);
    if (!bVar1) {
      pcVar5 = local_48->base_;
      pcVar4 = ConfigIter::base(local_48);
      Potassco::fail(-2,
                     "bool Clasp::Cli::ClaspCliConfig::setConfig(const ConfigIter &, uint8, uint32, const ParsedOpts &, ParsedOpts *)"
                     ,0x457,"Potassco::stringTo(config.base(), baseK)",
                     "%s: \'%s\': Invalid base config!",pcVar5 + 1,pcVar4,0);
    }
    __s = getConfig(local_4c);
    sVar2 = strlen(__s.base_);
    sVar3 = strlen(__s.base_ + sVar2 + 2);
    exclude = local_38;
    out = local_40;
    setConfig(this,__s.base_ + 1,__s.base_ + sVar3 + sVar2 + 4,mode | 1,sId,local_38,local_40);
    pcVar5 = local_48->base_;
  }
  sVar2 = strlen(pcVar5);
  sVar3 = strlen(pcVar5 + sVar2 + 2);
  setConfig(this,pcVar5 + 1,pcVar5 + sVar3 + sVar2 + 4,mode,sId,exclude,out);
  return true;
}

Assistant:

bool ClaspCliConfig::setConfig(const ConfigIter& config, uint8 mode, uint32 sId, const ParsedOpts& exclude, ParsedOpts* out) {
	if (*config.base()) {
		ConfigKey baseK = config_default;
		POTASSCO_REQUIRE(Potassco::stringTo(config.base(), baseK), "%s: '%s': Invalid base config!", config.name(), config.base());
		ConfigIter base = getConfig(baseK);
		if (!setConfig(base.name(), base.args(), mode | mode_solver, sId, exclude, out)) {
			return false;
		}
	}
	return setConfig(config.name(), config.args(), mode, sId, exclude, out);
}